

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamEuler::ComputeInternalForces
          (ChElementBeamEuler *this,ChVectorDynamic<> *Fi)

{
  ChMatrixDynamic<> *lhs;
  undefined1 (*pauVar1) [64];
  long *plVar2;
  undefined1 (*pauVar3) [32];
  double *pdVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  element_type *peVar13;
  element_type *peVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  byte bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  long lVar27;
  pointer psVar28;
  char *pcVar29;
  uint uVar30;
  Index index;
  ulong uVar31;
  double *pdVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  uint uVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  ChVectorDynamic<> Fi_local;
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> R;
  ChVectorDynamic<> displ_dt;
  ChVectorDynamic<> displ;
  ChMatrixDynamic<> FiR_local;
  ChVector<double> mFcent_i;
  ChVector<double> mTgyro_i;
  ChMatrix33<double> AtolocwelA;
  ChMatrix33<double> Atoabs;
  ChMatrix33<double> AtolocwelB;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_3d0;
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> local_3c0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_3a0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_390;
  Matrix<double,__1,__1,_1,__1,__1> local_378;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_360;
  ChVectorDynamic<> *local_318;
  long local_310;
  double local_308;
  long alStack_300 [2];
  double dStack_2f0;
  long lStack_2e8;
  long lStack_2e0;
  long lStack_2d8;
  ChMatrix33<double> CStack_2d0;
  undefined1 local_280 [16];
  undefined1 local_268 [40];
  ChMatrix33<double> local_240 [4];
  ChMatrix33<double> local_108;
  undefined1 local_c0 [16];
  double dStack_b0;
  double dStack_a8;
  
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0xc)
  {
    __assert_fail("Fi.size() == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamEuler.cpp"
                  ,0x2cb,
                  "virtual void chrono::fea::ChElementBeamEuler::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  if ((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    __assert_fail("section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamEuler.cpp"
                  ,0x2cc,
                  "virtual void chrono::fea::ChElementBeamEuler::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  local_390.m_storage.m_data = (double *)0x0;
  local_390.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_390,0xc);
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[6])
            (this,&local_390);
  if ((this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
      == local_390.m_storage.m_rows) {
    local_3d0.m_storage.m_data = (double *)0x0;
    local_3d0.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&local_3d0,
               (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
               .m_rows,1);
    uVar31 = (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_rows;
    if (local_3d0.m_storage.m_rows != uVar31) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_3d0,uVar31,1);
      uVar31 = local_3d0.m_storage.m_rows;
    }
    lhs = &this->Km;
    if (-1 < (long)uVar31) {
      if (uVar31 != 0) {
        memset(local_3d0.m_storage.m_data,0,uVar31 << 3);
      }
      local_240[0].super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
      Eigen::internal::
      generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
      ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&local_3d0,lhs,
                 (Matrix<double,__1,_1,_0,__1,_1> *)&local_390,(Scalar *)local_240);
      local_3a0.m_storage.m_data = (double *)0x0;
      local_3a0.m_storage.m_rows = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_3a0,0xc);
      GetField_dt(this,(ChVectorDynamic<> *)&local_3a0);
      dVar11 = (double)(this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                       m_storage.m_cols;
      dVar12 = (double)(this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                       m_storage.m_rows;
      if ((long)((ulong)dVar11 | (ulong)dVar12) < 0) {
        pcVar29 = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
        ;
        goto LAB_00662247;
      }
      local_240[0].super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           ((this->section).
            super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->rdamping_beta;
      local_240[0].super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           dVar12;
      local_240[0].super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           dVar11;
      local_240[0].super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           (double)lhs;
      local_240[0].super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           (double)&local_3a0;
      if (dVar11 != (double)local_3a0.m_storage.m_rows) {
        pcVar29 = 
        "Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
        ;
        goto LAB_006621f2;
      }
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
      PlainObjectBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_378,
                 (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)local_240);
      if ((local_3d0.m_storage.m_rows !=
           local_378.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows) ||
         (local_378.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_cols != 1)) {
LAB_00662169:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                     );
      }
      if (0 < local_3d0.m_storage.m_rows) {
        uVar31 = 0;
        do {
          local_3d0.m_storage.m_data[uVar31] =
               local_378.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
               m_data[uVar31] + local_3d0.m_storage.m_data[uVar31];
          uVar31 = uVar31 + 1;
        } while (local_3d0.m_storage.m_rows != uVar31);
      }
      dVar11 = ((this->section).
                super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->rdamping_alpha;
      if ((dVar11 != 0.0) || (NAN(dVar11))) {
        CStack_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0
        ;
        CStack_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0
        ;
        CStack_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0
        ;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                  ((DenseStorage<double,__1,__1,__1,_1> *)&CStack_2d0,0x90,0xc,0xc);
        local_240[0].super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
             CStack_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
        local_240[0].super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
             CStack_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
        local_240[0].super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0
        ;
        if ((long)((ulong)CStack_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[2] |
                  (ulong)CStack_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[1]) < 0) {
          pcVar29 = 
          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
          ;
          goto LAB_00662247;
        }
        Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                  ((Matrix<double,__1,__1,_1,__1,__1> *)&CStack_2d0,
                   (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                    *)local_240,(assign_op<double,_double> *)&local_108);
        peVar13 = (this->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        (*(peVar13->super_ChBeamSection)._vptr_ChBeamSection[0xd])(peVar13,local_240);
        if ((this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar31 = 0;
          dVar11 = (this->super_ChElementBeam).length * 0.5 *
                   ((this->section).
                    super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->rdamping_alpha;
          lVar27 = 0;
          do {
            lVar35 = uVar31 * 6 + 6;
            if (((long)CStack_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[1] < lVar35) ||
               ((long)CStack_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[2] < lVar35)) {
              __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                            ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                            "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 6, 6>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 6, BlockCols = 6, InnerPanel = false]"
                           );
            }
            pdVar32 = (double *)
                      ((long)CStack_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[0] +
                      ((long)CStack_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[2] + 1U) * lVar27 + 0x20);
            lVar35 = 0x20;
            do {
              dVar12 = *(double *)(local_268 + lVar35 + 0x10);
              pdVar32[-4] = dVar11 * *(double *)(local_268 + lVar35 + 8) + pdVar32[-4];
              pdVar32[-3] = dVar11 * dVar12 + pdVar32[-3];
              dVar12 = *(double *)(local_268 + lVar35 + 0x20);
              pdVar32[-2] = dVar11 * *(double *)(local_268 + lVar35 + 0x18) + pdVar32[-2];
              pdVar32[-1] = dVar11 * dVar12 + pdVar32[-1];
              pdVar4 = (double *)
                       ((long)local_240[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array + lVar35);
              dVar12 = *(double *)
                        ((long)local_240[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + lVar35 + 8);
              lVar35 = lVar35 + 0x30;
              *pdVar32 = dVar11 * *pdVar4 + *pdVar32;
              pdVar32[1] = dVar11 * dVar12 + pdVar32[1];
              pdVar32 = pdVar32 + (long)CStack_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                        .m_storage.m_data.array[2];
            } while (lVar35 != 0x140);
            uVar31 = uVar31 + 1;
            lVar27 = lVar27 + 0x30;
          } while (uVar31 < (ulong)((long)(this->nodes).
                                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->nodes).
                                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
        if (CStack_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
            != (double)local_3a0.m_storage.m_rows) goto LAB_0066214f;
        local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
             (double)&local_3a0;
        local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
             (double)&CStack_2d0;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
                  (&local_378,
                   (Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                    *)&local_108,(assign_op<double,_double> *)&local_360,(type)0x0);
        if ((local_3d0.m_storage.m_rows !=
             local_378.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_rows) ||
           (local_378.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols != 1)) goto LAB_00662169;
        if (0 < local_3d0.m_storage.m_rows) {
          uVar31 = 0;
          do {
            local_3d0.m_storage.m_data[uVar31] =
                 local_378.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_data[uVar31] + local_3d0.m_storage.m_data[uVar31];
            uVar31 = uVar31 + 1;
          } while (local_3d0.m_storage.m_rows != uVar31);
        }
        if ((double *)
            CStack_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
            != (double *)0x0) {
          free(*(void **)((long)CStack_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[0] + -8));
        }
      }
      if (-1 < local_3d0.m_storage.m_rows) {
        uVar31 = local_3d0.m_storage.m_rows & 0x7ffffffffffffff8;
        if (7 < (ulong)local_3d0.m_storage.m_rows) {
          auVar39 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
          uVar33 = 0;
          do {
            auVar40 = vxorpd_avx512dq(auVar39,*(undefined1 (*) [64])
                                               (local_3d0.m_storage.m_data + uVar33));
            *(undefined1 (*) [64])(local_3d0.m_storage.m_data + uVar33) = auVar40;
            uVar33 = uVar33 + 8;
          } while (uVar33 < uVar31);
        }
        if ((long)uVar31 < local_3d0.m_storage.m_rows) {
          auVar39 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar40 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
          auVar41 = vpbroadcastq_avx512f();
          uVar33 = 0;
          do {
            auVar42 = vpbroadcastq_avx512f();
            auVar42 = vporq_avx512f(auVar42,auVar39);
            uVar34 = vpcmpuq_avx512f(auVar42,auVar41,2);
            pdVar32 = local_3d0.m_storage.m_data + uVar31 + uVar33;
            auVar42._8_8_ = (ulong)((byte)(uVar34 >> 1) & 1) * (long)pdVar32[1];
            auVar42._0_8_ = (ulong)((byte)uVar34 & 1) * (long)*pdVar32;
            auVar42._16_8_ = (ulong)((byte)(uVar34 >> 2) & 1) * (long)pdVar32[2];
            auVar42._24_8_ = (ulong)((byte)(uVar34 >> 3) & 1) * (long)pdVar32[3];
            auVar42._32_8_ = (ulong)((byte)(uVar34 >> 4) & 1) * (long)pdVar32[4];
            auVar42._40_8_ = (ulong)((byte)(uVar34 >> 5) & 1) * (long)pdVar32[5];
            auVar42._48_8_ = (ulong)((byte)(uVar34 >> 6) & 1) * (long)pdVar32[6];
            auVar42._56_8_ = (uVar34 >> 7) * (long)pdVar32[7];
            auVar42 = vxorpd_avx512dq(auVar42,auVar40);
            pdVar32 = local_3d0.m_storage.m_data + uVar31 + uVar33;
            bVar17 = (bool)((byte)uVar34 & 1);
            bVar18 = (bool)((byte)(uVar34 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar34 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar34 >> 3) & 1);
            bVar21 = (bool)((byte)(uVar34 >> 4) & 1);
            bVar22 = (bool)((byte)(uVar34 >> 5) & 1);
            bVar23 = (bool)((byte)(uVar34 >> 6) & 1);
            *pdVar32 = (double)((ulong)bVar17 * auVar42._0_8_ | (ulong)!bVar17 * (long)*pdVar32);
            pdVar32[1] = (double)((ulong)bVar18 * auVar42._8_8_ | (ulong)!bVar18 * (long)pdVar32[1])
            ;
            pdVar32[2] = (double)((ulong)bVar19 * auVar42._16_8_ | (ulong)!bVar19 * (long)pdVar32[2]
                                 );
            pdVar32[3] = (double)((ulong)bVar20 * auVar42._24_8_ | (ulong)!bVar20 * (long)pdVar32[3]
                                 );
            pdVar32[4] = (double)((ulong)bVar21 * auVar42._32_8_ | (ulong)!bVar21 * (long)pdVar32[4]
                                 );
            pdVar32[5] = (double)((ulong)bVar22 * auVar42._40_8_ | (ulong)!bVar22 * (long)pdVar32[5]
                                 );
            pdVar32[6] = (double)((ulong)bVar23 * auVar42._48_8_ | (ulong)!bVar23 * (long)pdVar32[6]
                                 );
            pdVar32[7] = (double)((uVar34 >> 7) * auVar42._56_8_ |
                                 (ulong)!SUB81(uVar34 >> 7,0) * (long)pdVar32[7]);
            uVar33 = uVar33 + 8;
          } while ((((uint)local_3d0.m_storage.m_rows & 7) + 7 & 0xfffffff8) != uVar33);
        }
        ChMatrix33<double>::ChMatrix33(local_240,&this->q_element_abs_rot);
        psVar28 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        peVar14 = (psVar28->
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
        p_Var15 = (psVar28->
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          }
        }
        auVar37 = *(undefined1 (*) [32])(this->q_element_abs_rot).m_data;
        auVar38 = vpermpd_avx2(*(undefined1 (*) [32])((this->q_element_abs_rot).m_data + 2),0x15);
        auVar44._0_8_ = *(ulong *)&peVar14->field_0x40 ^ 0x8000000000000000;
        auVar44._8_8_ = *(ulong *)&peVar14->field_0x48 ^ 0x8000000000000000;
        auVar44._16_8_ = 0x8000000000000000;
        auVar44._24_8_ = 0x8000000000000000;
        uVar31 = *(ulong *)&peVar14->field_0x50 ^ 0x8000000000000000;
        auVar51._24_8_ = 0x8000000000000000;
        auVar51._16_8_ = uVar31;
        auVar24 = vpermpd_avx2(auVar44,0xd0);
        auVar59._8_8_ = uVar31;
        auVar59._0_8_ = uVar31;
        auVar59._16_8_ = uVar31;
        auVar59._24_8_ = uVar31;
        auVar51._0_16_ = *(undefined1 (*) [16])&peVar14->field_0x48;
        auVar48._16_8_ = *(ulong *)&peVar14->field_0x40;
        auVar48._0_16_ = *(undefined1 (*) [16])&peVar14->field_0x48;
        auVar48._24_8_ = 0;
        auVar44 = vpermpd_avx2(auVar44,0x11);
        auVar24 = vblendpd_avx(auVar24,ZEXT832(*(ulong *)&peVar14->field_0x40),1);
        auVar24 = vblendpd_avx(auVar24,auVar59,8);
        auVar51 = vpermpd_avx2(auVar51,0x24);
        auVar44 = vshufpd_avx(auVar48,auVar44,9);
        auVar48 = vpermpd_avx2(auVar37,1);
        auVar57._0_8_ = auVar48._0_8_ * auVar24._0_8_;
        auVar57._8_8_ = auVar48._8_8_ * auVar24._8_8_;
        auVar57._16_8_ = auVar48._16_8_ * auVar24._16_8_;
        auVar57._24_8_ = auVar48._24_8_ * auVar24._24_8_;
        uVar5 = *(undefined8 *)&peVar14->field_0x38;
        auVar24._8_8_ = uVar5;
        auVar24._0_8_ = uVar5;
        auVar24._16_8_ = uVar5;
        auVar24._24_8_ = uVar5;
        auVar37 = vfmadd231pd_avx512vl(auVar57,auVar37,auVar24);
        dVar11 = (this->q_element_abs_rot).m_data[2];
        auVar54._8_8_ = dVar11;
        auVar54._0_8_ = dVar11;
        dVar11 = (this->q_element_abs_rot).m_data[1];
        auVar54._24_8_ = dVar11;
        auVar54._16_8_ = dVar11;
        auVar25 = vfmadd213pd_fma(auVar54,auVar51,auVar37);
        auVar25 = vfmadd213pd_fma(auVar44,auVar38,ZEXT1632(auVar25));
        local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_32_ =
             ZEXT1632(auVar25);
        ChMatrix33<double>::ChMatrix33(&CStack_2d0,(ChQuaternion<double> *)&local_108);
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
        }
        psVar28 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        peVar14 = psVar28[1].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var15 = psVar28[1].
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          }
        }
        auVar37 = *(undefined1 (*) [32])(this->q_element_abs_rot).m_data;
        auVar38 = vpermpd_avx2(*(undefined1 (*) [32])((this->q_element_abs_rot).m_data + 2),0x15);
        auVar45._0_8_ = *(ulong *)&peVar14->field_0x40 ^ 0x8000000000000000;
        auVar45._8_8_ = *(ulong *)&peVar14->field_0x48 ^ 0x8000000000000000;
        auVar45._16_8_ = 0x8000000000000000;
        auVar45._24_8_ = 0x8000000000000000;
        uVar31 = *(ulong *)&peVar14->field_0x50 ^ 0x8000000000000000;
        auVar52._24_8_ = 0x8000000000000000;
        auVar52._16_8_ = uVar31;
        auVar24 = vpermpd_avx2(auVar45,0xd0);
        auVar60._8_8_ = uVar31;
        auVar60._0_8_ = uVar31;
        auVar60._16_8_ = uVar31;
        auVar60._24_8_ = uVar31;
        auVar52._0_16_ = *(undefined1 (*) [16])&peVar14->field_0x48;
        auVar49._16_8_ = *(ulong *)&peVar14->field_0x40;
        auVar49._0_16_ = *(undefined1 (*) [16])&peVar14->field_0x48;
        auVar49._24_8_ = 0;
        auVar44 = vpermpd_avx2(auVar45,0x11);
        auVar24 = vblendpd_avx(auVar24,ZEXT832(*(ulong *)&peVar14->field_0x40),1);
        auVar24 = vblendpd_avx(auVar24,auVar60,8);
        auVar51 = vpermpd_avx2(auVar52,0x24);
        auVar44 = vshufpd_avx(auVar49,auVar44,9);
        auVar48 = vpermpd_avx2(auVar37,1);
        auVar58._0_8_ = auVar48._0_8_ * auVar24._0_8_;
        auVar58._8_8_ = auVar48._8_8_ * auVar24._8_8_;
        auVar58._16_8_ = auVar48._16_8_ * auVar24._16_8_;
        auVar58._24_8_ = auVar48._24_8_ * auVar24._24_8_;
        uVar5 = *(undefined8 *)&peVar14->field_0x38;
        auVar26._8_8_ = uVar5;
        auVar26._0_8_ = uVar5;
        auVar26._16_8_ = uVar5;
        auVar26._24_8_ = uVar5;
        auVar37 = vfmadd231pd_avx512vl(auVar58,auVar37,auVar26);
        dVar11 = (this->q_element_abs_rot).m_data[2];
        auVar55._8_8_ = dVar11;
        auVar55._0_8_ = dVar11;
        dVar11 = (this->q_element_abs_rot).m_data[1];
        auVar55._24_8_ = dVar11;
        auVar55._16_8_ = dVar11;
        auVar25 = vfmadd213pd_fma(auVar55,auVar51,auVar37);
        auVar25 = vfmadd213pd_fma(auVar44,auVar38,ZEXT1632(auVar25));
        local_360.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        ._0_32_ = ZEXT1632(auVar25);
        ChMatrix33<double>::ChMatrix33(&local_108,(ChQuaternion<double> *)&local_360);
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
        }
        local_3c0.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3c0.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (ChMatrix33<double> **)0x0;
        local_3c0.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (ChMatrix33<double> **)0x0;
        local_360.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = (PointerType)local_240;
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        _M_realloc_insert<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_3c0,(iterator)0x0,(ChMatrix33<double> **)&local_360);
        if (local_3c0.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_3c0.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_360.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_data = (PointerType)&CStack_2d0;
          std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
          _M_realloc_insert<chrono::ChMatrix33<double>*>
                    ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                      *)&local_3c0,
                     (iterator)
                     local_3c0.
                     super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)&local_360);
        }
        else {
          *local_3c0.
           super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = &CStack_2d0;
          local_3c0.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_3c0.
               super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (local_3c0.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_3c0.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_360.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_data = (PointerType)local_240;
          std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
          _M_realloc_insert<chrono::ChMatrix33<double>*>
                    ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                      *)&local_3c0,
                     (iterator)
                     local_3c0.
                     super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)&local_360);
        }
        else {
          *local_3c0.
           super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = local_240;
          local_3c0.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_3c0.
               super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        local_360.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = (PointerType)&local_108;
        if (local_3c0.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_3c0.
            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
          _M_realloc_insert<chrono::ChMatrix33<double>*>
                    ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                      *)&local_3c0,
                     (iterator)
                     local_3c0.
                     super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)&local_360);
        }
        else {
          *local_3c0.
           super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = &local_108;
          local_3c0.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_3c0.
               super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        local_360.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
        m_storage.m_cols = 0;
        local_360.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
        m_storage.m_data = (double *)0x0;
        local_360.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
        m_storage.m_rows = 0;
        local_360.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value = local_3d0.m_storage.m_rows;
        local_360.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = local_3d0.m_storage.m_data;
        local_360.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = 1;
        local_360.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 0;
        if (local_3d0.m_storage.m_rows < 0 && local_3d0.m_storage.m_data != (double *)0x0) {
          pcVar29 = 
          "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
          ;
        }
        else {
          local_268._24_8_ = 0;
          local_360.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .m_stride.m_outer.m_value = 1;
          local_268._0_8_ =
               (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
          ;
          local_268._8_8_ =
               (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
          ;
          local_268._16_8_ = 1;
          if (-1 < (long)local_268._8_8_ || (double *)local_268._0_8_ == (double *)0x0) {
            local_268._24_8_ = 1;
            ChMatrixCorotation::ComputeCK(&local_360,&local_3c0,4,(ChMatrixRef *)local_268);
            local_318 = Fi;
            if (local_360.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data != (double *)0x0) {
              free((void *)local_360.m_object.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_data[-1]);
            }
            local_360.
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value = 0;
            local_360.
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            ._0_16_ = ZEXT816(0);
            lStack_2e0 = 0;
            dStack_2f0 = 0.0;
            lStack_2e8 = 0;
            psVar28 = (this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != psVar28) {
              lVar35 = 0x18;
              lVar27 = 0;
              uVar31 = 0;
              local_280._8_8_ = 0;
              local_280._0_8_ = (this->super_ChElementBeam).length * 0.5;
              _local_c0 = vbroadcastsd_avx512f(local_280);
              do {
                peVar13 = (this->section).
                          super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
                local_310 = lVar27;
                ChFrameMoving<double>::GetWvel_loc
                          ((ChFrameMoving<double> *)
                           &((psVar28[uVar31].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase).field_0x18);
                (*(peVar13->super_ChBeamSection)._vptr_ChBeamSection[0x10])
                          (peVar13,&local_360,&dStack_2f0,&local_308);
                auVar43._8_8_ = 0;
                auVar43._0_8_ =
                     local_360.
                     super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                     .
                     super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                     .m_data;
                auVar53._8_8_ = 0;
                auVar53._0_8_ =
                     local_360.
                     super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                     .
                     super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                     .m_cols.m_value;
                peVar14 = (this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar31].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
                auVar25._8_8_ = 0;
                auVar25._0_8_ = *(ulong *)&peVar14->field_0x58;
                auVar50._8_8_ = 0;
                auVar50._0_8_ =
                     (double)local_360.
                             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                             .
                             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                             .m_rows.m_value * *(double *)&peVar14->field_0x60;
                auVar25 = vfmadd231sd_fma(auVar50,auVar43,auVar25);
                auVar6._8_8_ = 0;
                auVar6._0_8_ = *(ulong *)&peVar14->field_0x70;
                auVar56._8_8_ = 0;
                auVar56._0_8_ =
                     (double)local_360.
                             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                             .
                             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                             .m_rows.m_value * *(double *)&peVar14->field_0x78;
                auVar6 = vfmadd231sd_fma(auVar56,auVar43,auVar6);
                auVar7._8_8_ = 0;
                auVar7._0_8_ = *(ulong *)&peVar14->field_0x88;
                auVar47._8_8_ = 0;
                auVar47._0_8_ =
                     (double)local_360.
                             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                             .
                             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                             .m_rows.m_value * *(double *)&peVar14->field_0x90;
                auVar7 = vfmadd231sd_fma(auVar47,auVar43,auVar7);
                auVar8._8_8_ = 0;
                auVar8._0_8_ = *(ulong *)&peVar14->field_0x68;
                auVar25 = vfmadd231sd_fma(auVar25,auVar53,auVar8);
                auVar9._8_8_ = 0;
                auVar9._0_8_ = *(ulong *)&peVar14->field_0x80;
                auVar6 = vfmadd231sd_fma(auVar6,auVar53,auVar9);
                auVar10._8_8_ = 0;
                auVar10._0_8_ = *(ulong *)&peVar14->field_0x98;
                auVar7 = vfmadd231sd_fma(auVar7,auVar53,auVar10);
                local_308 = auVar25._0_8_;
                alStack_300[0] = auVar6._0_8_;
                alStack_300[1] = auVar7._0_8_;
                lVar27 = (local_318->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                         .m_storage.m_rows + -3;
                if (lVar27 < (long)(uVar31 * 6)) goto LAB_006620f4;
                pdVar32 = (local_318->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                          ).m_storage.m_data;
                uVar30 = 3;
                pauVar1 = (undefined1 (*) [64])(pdVar32 + uVar31 * 6);
                if (((ulong)pauVar1 & 7) == 0) {
                  uVar36 = -((uint)((ulong)pauVar1 >> 3) & 0x1fffffff) & 7;
                  if (uVar36 < 3) {
                    uVar30 = uVar36;
                  }
                  if (uVar36 != 0) goto LAB_00661f37;
                }
                else {
LAB_00661f37:
                  auVar39 = vpbroadcastq_avx512f();
                  uVar33 = vpcmpuq_avx512f(auVar39,_DAT_00972380,5);
                  bVar16 = (byte)uVar33;
                  auVar39._8_8_ = (ulong)((byte)(uVar33 >> 1) & 1) * auVar6._0_8_;
                  auVar39._0_8_ = (ulong)(bVar16 & 1) * (long)auVar25._0_8_;
                  auVar39._16_8_ = (ulong)((byte)(uVar33 >> 2) & 1) * auVar7._0_8_;
                  auVar39._24_8_ = (ulong)((byte)(uVar33 >> 3) & 1) * (long)dStack_2f0;
                  auVar39._32_8_ = (ulong)((byte)(uVar33 >> 4) & 1) * lStack_2e8;
                  auVar39._40_8_ = (ulong)((byte)(uVar33 >> 5) & 1) * lStack_2e0;
                  auVar39._48_8_ = (ulong)((byte)(uVar33 >> 6) & 1) * lStack_2d8;
                  auVar39._56_8_ =
                       (uVar33 >> 7) *
                       (long)CStack_2d0.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[0];
                  auVar40._8_8_ =
                       (ulong)((byte)(uVar33 >> 1) & 1) * (long)*(double *)((long)*pauVar1 + 8);
                  auVar40._0_8_ = (ulong)(bVar16 & 1) * (long)*(double *)*pauVar1;
                  auVar40._16_8_ =
                       (ulong)((byte)(uVar33 >> 2) & 1) * (long)*(double *)((long)*pauVar1 + 0x10);
                  auVar40._24_8_ =
                       (ulong)((byte)(uVar33 >> 3) & 1) * (long)*(double *)((long)*pauVar1 + 0x18);
                  auVar40._32_8_ =
                       (ulong)((byte)(uVar33 >> 4) & 1) * (long)*(double *)((long)*pauVar1 + 0x20);
                  auVar40._40_8_ =
                       (ulong)((byte)(uVar33 >> 5) & 1) * (long)*(double *)((long)*pauVar1 + 0x28);
                  auVar40._48_8_ =
                       (ulong)((byte)(uVar33 >> 6) & 1) * (long)*(double *)((long)*pauVar1 + 0x30);
                  auVar40._56_8_ = (uVar33 >> 7) * (long)*(double *)((long)*pauVar1 + 0x38);
                  auVar39 = vmulpd_avx512f(auVar39,_local_c0);
                  auVar39 = vsubpd_avx512f(auVar40,auVar39);
                  auVar41._0_8_ =
                       (ulong)(bVar16 & 1) * auVar39._0_8_ |
                       (ulong)!(bool)(bVar16 & 1) * (long)*(double *)*pauVar1;
                  bVar17 = (bool)((byte)(uVar33 >> 1) & 1);
                  auVar41._8_8_ =
                       (ulong)bVar17 * auVar39._8_8_ |
                       (ulong)!bVar17 * (long)*(double *)((long)*pauVar1 + 8);
                  bVar17 = (bool)((byte)(uVar33 >> 2) & 1);
                  auVar41._16_8_ =
                       (ulong)bVar17 * auVar39._16_8_ |
                       (ulong)!bVar17 * (long)*(double *)((long)*pauVar1 + 0x10);
                  bVar17 = (bool)((byte)(uVar33 >> 3) & 1);
                  auVar41._24_8_ =
                       (ulong)bVar17 * auVar39._24_8_ |
                       (ulong)!bVar17 * (long)*(double *)((long)*pauVar1 + 0x18);
                  bVar17 = (bool)((byte)(uVar33 >> 4) & 1);
                  auVar41._32_8_ =
                       (ulong)bVar17 * auVar39._32_8_ |
                       (ulong)!bVar17 * (long)*(double *)((long)*pauVar1 + 0x20);
                  bVar17 = (bool)((byte)(uVar33 >> 5) & 1);
                  auVar41._40_8_ =
                       (ulong)bVar17 * auVar39._40_8_ |
                       (ulong)!bVar17 * (long)*(double *)((long)*pauVar1 + 0x28);
                  bVar17 = (bool)((byte)(uVar33 >> 6) & 1);
                  auVar41._48_8_ =
                       (ulong)bVar17 * auVar39._48_8_ |
                       (ulong)!bVar17 * (long)*(double *)((long)*pauVar1 + 0x30);
                  auVar41._56_8_ =
                       (uVar33 >> 7) * auVar39._56_8_ |
                       (ulong)!SUB81(uVar33 >> 7,0) * (long)*(double *)((long)*pauVar1 + 0x38);
                  *pauVar1 = auVar41;
                }
                if (uVar30 < 3) {
                  uVar34 = (ulong)(uVar30 << 3);
                  auVar37 = vpbroadcastq_avx512vl();
                  uVar33 = vpcmpuq_avx512vl(auVar37,_DAT_00955380,5);
                  uVar33 = uVar33 & 0xf;
                  bVar16 = (byte)uVar33;
                  plVar2 = (long *)((long)*pauVar1 + uVar34);
                  auVar37._8_8_ = (ulong)((byte)(uVar33 >> 1) & 1) * plVar2[1];
                  auVar37._0_8_ = (ulong)(bVar16 & 1) * *plVar2;
                  auVar37._16_8_ = (ulong)((byte)(uVar33 >> 2) & 1) * plVar2[2];
                  auVar37._24_8_ = (uVar33 >> 3) * plVar2[3];
                  auVar46._0_8_ =
                       (double)((ulong)(bVar16 & 1) * *(long *)((long)&local_308 + uVar34)) *
                       (double)local_c0._0_8_;
                  auVar46._8_8_ =
                       (double)((ulong)((byte)(uVar33 >> 1) & 1) *
                               *(long *)((long)alStack_300 + uVar34)) * (double)local_c0._8_8_;
                  auVar46._16_8_ =
                       (double)((ulong)((byte)(uVar33 >> 2) & 1) *
                               *(long *)((long)alStack_300 + uVar34 + 8)) * dStack_b0;
                  auVar46._24_8_ =
                       (double)((uVar33 >> 3) * *(long *)((long)&dStack_2f0 + uVar34)) * dStack_a8;
                  auVar37 = vsubpd_avx(auVar37,auVar46);
                  pauVar3 = (undefined1 (*) [32])((long)*pauVar1 + uVar34);
                  auVar38._0_8_ =
                       (ulong)(bVar16 & 1) * auVar37._0_8_ |
                       (ulong)!(bool)(bVar16 & 1) * *(long *)*pauVar3;
                  bVar17 = (bool)((byte)(uVar33 >> 1) & 1);
                  auVar38._8_8_ =
                       (ulong)bVar17 * auVar37._8_8_ | (ulong)!bVar17 * *(long *)(*pauVar3 + 8);
                  bVar17 = (bool)((byte)(uVar33 >> 2) & 1);
                  auVar38._16_8_ =
                       (ulong)bVar17 * auVar37._16_8_ | (ulong)!bVar17 * *(long *)(*pauVar3 + 0x10);
                  auVar38._24_8_ =
                       (uVar33 >> 3) * auVar37._24_8_ |
                       (ulong)!SUB81(uVar33 >> 3,0) * *(long *)(*pauVar3 + 0x18);
                  *pauVar3 = auVar38;
                }
                if (lVar27 < (long)(uVar31 * 6 + 3)) {
LAB_006620f4:
                  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                               );
                }
                uVar33 = 3;
                if (((ulong)(pdVar32 + uVar31 * 6 + 3) & 7) == 0) {
                  uVar30 = -((uint)((ulong)(pdVar32 + uVar31 * 6 + 3) >> 3) & 0x1fffffff) & 7;
                  if ((ulong)uVar30 < 3) {
                    uVar33 = (ulong)uVar30;
                  }
                  if (uVar30 != 0) goto LAB_00661fea;
                }
                else {
LAB_00661fea:
                  uVar34 = 0;
                  do {
                    *(double *)((long)pdVar32 + uVar34 * 8 + lVar35) =
                         *(double *)((long)pdVar32 + uVar34 * 8 + lVar35) -
                         (double)local_280._0_8_ * (&dStack_2f0)[uVar34];
                    uVar34 = uVar34 + 1;
                  } while (uVar33 != uVar34);
                }
                if (uVar33 < 3) {
                  lVar27 = uVar33 + 3;
                  do {
                    *(double *)((long)pdVar32 + lVar27 * 8 + local_310) =
                         *(double *)((long)pdVar32 + lVar27 * 8 + local_310) -
                         (double)local_280._0_8_ * (&local_308)[lVar27];
                    lVar27 = lVar27 + 1;
                  } while (lVar27 != 6);
                }
                psVar28 = (this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar31 = uVar31 + 1;
                lVar35 = lVar35 + 0x30;
                lVar27 = local_310 + 0x30;
              } while (uVar31 < (ulong)((long)(this->nodes).
                                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)psVar28 >> 4));
            }
            if (local_3c0.
                super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_3c0.
                              super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_3c0.
                                    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_3c0.
                                    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_378.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
                .m_data != (double *)0x0) {
              free((void *)local_378.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_data[-1]);
            }
            if (local_3a0.m_storage.m_data != (double *)0x0) {
              free((void *)local_3a0.m_storage.m_data[-1]);
            }
            if (local_3d0.m_storage.m_data != (double *)0x0) {
              free((void *)local_3d0.m_storage.m_data[-1]);
            }
            if (local_390.m_storage.m_data != (double *)0x0) {
              free((void *)local_390.m_storage.m_data[-1]);
            }
            return;
          }
          pcVar29 = 
          "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
          ;
        }
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar29);
      }
    }
    pcVar29 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
LAB_00662247:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar29);
  }
LAB_0066214f:
  pcVar29 = 
  "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
  ;
LAB_006621f2:
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar29);
}

Assistant:

void ChElementBeamEuler::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 12);
    assert(section);

    // set up vector of nodal displacements and small rotations (in local element system)
    ChVectorDynamic<> displ(12);
    this->GetStateBlock(displ);

    // [local Internal Forces] = [Klocal] * displ + [Rlocal] * displ_dt
    ChVectorDynamic<> Fi_local = Km * displ;

    // set up vector of nodal velocities (in local element system)
    ChVectorDynamic<> displ_dt(12);
    this->GetField_dt(displ_dt);

    // Rayleigh damping - stiffness proportional
    ChMatrixDynamic<> FiR_local = section->GetBeamRaleyghDampingBeta() * Km * displ_dt;

    Fi_local += FiR_local;

    // Rayleigh damping - mass proportional
    if (this->section->GetBeamRaleyghDampingAlpha()) {
        ChMatrixDynamic<> Mloc(12, 12);
        Mloc.setZero();
        ChMatrix33<> Mxw;

        // the "lumped" M mass matrix must be computed
        ChMatrixNM<double, 6, 6> sectional_mass;
        this->section->ComputeInertiaMatrix(sectional_mass);

        // Rayleigh damping (stiffness proportional part)  [Rm] = alpha*[M] 
        double node_multiplier_fact = 0.5 * length * (this->section->GetBeamRaleyghDampingAlpha());
        for (int i = 0; i < nodes.size(); ++i) {
            int stride = i * 6; 
            Mloc.block<6, 6>(stride, stride) += sectional_mass * node_multiplier_fact;
        }
        FiR_local = Mloc * displ_dt;
        Fi_local += FiR_local;
    }

    Fi_local *= -1.0;

    //
    // Corotate local internal loads
    //

    // Fi = C * Fi_local  with C block-diagonal rotations A  , for nodal forces in abs. frame
    ChMatrix33<> Atoabs(this->q_element_abs_rot);
    ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
    ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
    std::vector<ChMatrix33<>*> R;
    R.push_back(&Atoabs);
    R.push_back(&AtolocwelA);
    R.push_back(&Atoabs);
    R.push_back(&AtolocwelB);
    ChMatrixCorotation::ComputeCK(Fi_local, R, 4, Fi);


    // Add also inertial quadratic terms: gyroscopic and centrifugal
    
    // CASE OF LUMPED MASS - fast
    double node_multiplier = 0.5 * length;
    ChVector<> mFcent_i;
    ChVector<> mTgyro_i;
    for (int i = 0; i < nodes.size(); ++i) {
        this->section->ComputeQuadraticTerms(mFcent_i, mTgyro_i, nodes[i]->GetWvel_loc());
        Fi.segment(i * 6, 3)     -= node_multiplier * (nodes[i]->GetA() * mFcent_i).eigen();
        Fi.segment(3 + i * 6, 3) -= node_multiplier * mTgyro_i.eigen();
    }

#ifdef BEAM_VERBOSE
    GetLog() << "\nInternal forces (local): \n";
    for (int c = 0; c < 6; c++)
        GetLog() << FiK_local(c) << "  ";
    GetLog() << "\n";
    for (int c = 6; c < 12; c++)
        GetLog() << FiK_local(c) << "  ";
    GetLog() << "\n\nInternal forces (ABS) : \n";
    for (int c = 0; c < 6; c++)
        GetLog() << Fi(c) << "  ";
    GetLog() << "\n";
    for (int c = 6; c < 12; c++)
        GetLog() << Fi(c) << "  ";
    GetLog() << "\n";
#endif
}